

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O1

ThisType * Gs::Matrix<float,_3UL,_3UL>::Identity(void)

{
  float *pfVar1;
  size_t c;
  long lVar2;
  size_t r_1;
  float *pfVar3;
  size_t r;
  long lVar4;
  ThisType *result;
  float *in_RDI;
  float fVar5;
  
  pfVar1 = in_RDI;
  lVar2 = 0;
  pfVar3 = in_RDI;
  do {
    lVar4 = 0;
    do {
      fVar5 = 1.0;
      if (lVar2 != lVar4) {
        fVar5 = 0.0;
      }
      pfVar3[lVar4] = fVar5;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    lVar2 = lVar2 + 1;
    pfVar3 = pfVar3 + 3;
  } while (lVar2 != 3);
  lVar2 = 0;
  do {
    lVar4 = 0;
    do {
      fVar5 = 1.0;
      if (lVar2 != lVar4) {
        fVar5 = 0.0;
      }
      in_RDI[lVar4] = fVar5;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    lVar2 = lVar2 + 1;
    in_RDI = in_RDI + 3;
  } while (lVar2 != 3);
  return (ThisType *)pfVar1;
}

Assistant:

static ThisType Identity()
        {
            ThisType result;
            result.LoadIdentity();
            return result;
        }